

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDEdge * __thiscall
ON_SubDimple::AddEdge
          (ON_SubDimple *this,uint candidate_edge_id,ON_SubDEdgeTag edge_tag,ON_SubDVertex *v0,
          double v0_sector_coefficient,ON_SubDVertex *v1,double v1_sector_coefficient,
          uint initial_face_capacity)

{
  ushort uVar1;
  ON_SubDVertex *v;
  bool bVar2;
  uint uVar3;
  ON_SubDEdge *e;
  ON_SubDEdge *pOVar4;
  ON_SubDHeap *this_00;
  ulong uVar5;
  double dVar6;
  double local_50;
  double local_40;
  
  bVar2 = ON_SubDSectorType::IsValidSectorCoefficientValue(v0_sector_coefficient,true);
  if (((!bVar2) ||
      (bVar2 = ON_SubDSectorType::IsValidSectorCoefficientValue(v1_sector_coefficient,true), !bVar2)
      ) || ((v1 != (ON_SubDVertex *)0x0 && v0 != (ON_SubDVertex *)0x0 &&
            ((v0->super_ON_SubDComponentBase).m_level != (v1->super_ON_SubDComponentBase).m_level)))
     ) goto LAB_005dcbd7;
  local_50 = v1_sector_coefficient;
  local_40 = v0_sector_coefficient;
  if (edge_tag < (SmoothX|Smooth)) {
    if ((0x16U >> (edge_tag & 0x1f) & 1) != 0) {
      local_50 = 0.0;
      if ((((v0_sector_coefficient != 0.0) || (NAN(v0_sector_coefficient))) &&
          (v0 != (ON_SubDVertex *)0x0)) &&
         (((v0_sector_coefficient != -8883.0 || (NAN(v0_sector_coefficient))) &&
          (v0->m_vertex_tag == Smooth)))) {
        local_40 = 0.0;
      }
      if (((v1_sector_coefficient != 0.0) || (NAN(v1_sector_coefficient))) &&
         ((v1 != (ON_SubDVertex *)0x0 &&
          (((v1_sector_coefficient != -8883.0 || (NAN(v1_sector_coefficient))) &&
           (v1->m_vertex_tag == Smooth)))))) goto LAB_005dcae8;
    }
    local_50 = v1_sector_coefficient;
  }
LAB_005dcae8:
  this_00 = &this->m_heap;
  e = ON_SubDHeap::AllocateEdgeAndSetId(this_00,candidate_edge_id);
  e->m_edge_tag = edge_tag;
  (e->super_ON_SubDComponentBase).m_level = '\0';
  if (v0 == (ON_SubDVertex *)0x0) {
    if (v1 != (ON_SubDVertex *)0x0) {
      uVar3 = (uint)(v1->super_ON_SubDComponentBase).m_level;
      goto LAB_005dcb23;
    }
    if (this->m_active_level == (ON_SubDLevel *)0x0) {
      uVar3 = 0;
      goto LAB_005dcb23;
    }
    uVar3 = this->m_active_level->m_level_index;
    if (uVar3 < 0x100) goto LAB_005dcb23;
  }
  else {
    uVar3 = (uint)(v0->super_ON_SubDComponentBase).m_level;
LAB_005dcb23:
    (e->super_ON_SubDComponentBase).m_level = (uchar)uVar3;
  }
  for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
    dVar6 = local_40;
    v = v0;
    if (uVar5 != 0) {
      dVar6 = local_50;
      v = v1;
    }
    e->m_vertex[uVar5] = v;
    e->m_sector_coefficient[uVar5] = dVar6;
    if (v != (ON_SubDVertex *)0x0) {
      bVar2 = ON_SubDHeap::GrowVertexEdgeArrayByOne(this_00,v);
      if (!bVar2) {
        ON_ComponentStatus::SetDamagedState(&(v->super_ON_SubDComponentBase).m_status,true);
        ReturnEdge(this,e);
        goto LAB_005dcbd7;
      }
      uVar1 = v->m_edge_count;
      v->m_edge_count = uVar1 + 1;
      v->m_edges[uVar1].m_ptr = uVar5 | (ulong)e;
    }
  }
  pOVar4 = AddEdgeToLevel(this,e);
  if (pOVar4 != (ON_SubDEdge *)0x0) {
    if (initial_face_capacity < 3) {
      return e;
    }
    ON_SubDHeap::GrowEdgeFaceArray(this_00,e,(ulong)initial_face_capacity);
    return e;
  }
LAB_005dcbd7:
  ON_SubDIncrementErrorCount();
  return (ON_SubDEdge *)0x0;
}

Assistant:

class ON_SubDEdge* ON_SubDimple::AddEdge(
  unsigned int candidate_edge_id,
  ON_SubDEdgeTag edge_tag,
  ON_SubDVertex* v0,
  double v0_sector_coefficient,
  ON_SubDVertex* v1,
  double v1_sector_coefficient,
  unsigned initial_face_capacity
)
{
  if (false == ON_SubDSectorType::IsValidSectorCoefficientValue(v0_sector_coefficient, true))
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (false == ON_SubDSectorType::IsValidSectorCoefficientValue(v1_sector_coefficient, true))
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (nullptr != v0 && nullptr != v1 && v0->SubdivisionLevel() != v1->SubdivisionLevel())
    return ON_SUBD_RETURN_ERROR(nullptr);

  const bool bEdgeTagSet = ON_SubD::EdgeTagIsSet(edge_tag);

  if (bEdgeTagSet
    && ON_SubDSectorType::IgnoredSectorCoefficient != v0_sector_coefficient
    && ON_SubDSectorType::UnsetSectorCoefficient != v0_sector_coefficient
    && nullptr != v0
    && ON_SubDVertexTag::Smooth == v0->m_vertex_tag
    )
  {
    // minimizes checking when building subds because constant crease coefficients can be passed in
    v0_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
  }

  if (bEdgeTagSet
    && ON_SubDSectorType::IgnoredSectorCoefficient != v1_sector_coefficient
    && ON_SubDSectorType::UnsetSectorCoefficient != v1_sector_coefficient
    && nullptr != v1
    && ON_SubDVertexTag::Smooth == v1->m_vertex_tag
    )
  {
    // minimizes checking when building subds because constant crease coefficients can be passed in
    v1_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
  }

  class ON_SubDEdge* e = AllocateEdge(candidate_edge_id, edge_tag, 0, 0);
  if (nullptr == e)
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (nullptr != v0)
    e->SetSubdivisionLevel(v0->SubdivisionLevel());
  else if (nullptr != v1)
    e->SetSubdivisionLevel(v1->SubdivisionLevel());
  else if (ActiveLevelIndex() < ON_UNSET_UINT_INDEX)
    e->SetSubdivisionLevel(ActiveLevelIndex());

  for (unsigned int i = 0; i < 2; i++)
  {
    ON_SubDVertex* v = (i ? v1 : v0);
    double vertex_coefficient = (i ? v1_sector_coefficient : v0_sector_coefficient);
    e->m_vertex[i] = v;
    e->m_sector_coefficient[i] = vertex_coefficient;
    if (nullptr != v)
    {
      if (false == m_heap.GrowVertexEdgeArrayByOne(v))
      {
        v->m_status.SetDamagedState(true);
        ReturnEdge(e);
        return ON_SUBD_RETURN_ERROR(nullptr);
      }
      v->m_edges[v->m_edge_count++] = ON_SubDEdgePtr::Create(e, i);
    }
  }

  if ( nullptr == AddEdgeToLevel(e) )
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (initial_face_capacity > 2)
  {
    m_heap.GrowEdgeFaceArray(e, initial_face_capacity);
  }

  return e;
}